

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  ulong uVar1;
  char local_19;
  FrameworkDescriptor *local_18;
  FrameworkDescriptor *this_local;
  
  local_18 = this;
  this_local = (FrameworkDescriptor *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_19 = ',';
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (__return_storage_ptr__,&this->Name,&local_19,&this->Suffix);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLinkName() const
    {
      return this->Suffix.empty() ? this->Name
                                  : cmStrCat(this->Name, ',', this->Suffix);
    }